

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::Calendar(Calendar *this,TimeZone *zone,Locale *aLocale,UErrorCode *success)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UErrorCode *success_local;
  Locale *aLocale_local;
  TimeZone *zone_local;
  Calendar *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)0x0;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Calendar_004f79b8;
  this->fIsTimeSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsVirtuallySet = '\0';
  this->fNextStamp = 2;
  this->fTime = 0.0;
  this->fLenient = '\x01';
  this->fZone = (TimeZone *)0x0;
  this->fRepeatedWallTime = UCAL_WALLTIME_LAST;
  this->fSkippedWallTime = UCAL_WALLTIME_LAST;
  this->validLocale[0] = '\0';
  this->actualLocale[0] = '\0';
  UVar1 = ::U_FAILURE(*success);
  if (UVar1 == '\0') {
    clear(this);
    iVar2 = (*(zone->super_UObject)._vptr_UObject[0xc])();
    this->fZone = (TimeZone *)CONCAT44(extraout_var,iVar2);
    if (this->fZone == (TimeZone *)0x0) {
      *success = U_MEMORY_ALLOCATION_ERROR;
    }
    setWeekData(this,aLocale,(char *)0x0,success);
  }
  return;
}

Assistant:

Calendar::Calendar(const TimeZone& zone, const Locale& aLocale, UErrorCode& success)
:   UObject(),
fIsTimeSet(FALSE),
fAreFieldsSet(FALSE),
fAreAllFieldsSet(FALSE),
fAreFieldsVirtuallySet(FALSE),
fNextStamp((int32_t)kMinimumUserStamp),
fTime(0),
fLenient(TRUE),
fZone(NULL),
fRepeatedWallTime(UCAL_WALLTIME_LAST),
fSkippedWallTime(UCAL_WALLTIME_LAST)
{
    validLocale[0] = 0;
    actualLocale[0] = 0;
    if (U_FAILURE(success)) {
        return;
    }
    clear();
    fZone = zone.clone();
    if (fZone == NULL) {
        success = U_MEMORY_ALLOCATION_ERROR;
    }
    setWeekData(aLocale, NULL, success);
}